

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgGetDeviceID(uchar *ss,uint idLen,uint *aReadLen)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *byte;
  uchar countLSB;
  uchar countMSB;
  undefined2 local_4a;
  uint *local_48;
  uint local_3c;
  ulong local_38;
  
  local_4a = local_4a & 0xff00;
  if (((byte)ZvgIO.ecpFlags & 1) != 0) {
    terminate_1284();
  }
  uVar2 = 0x13;
  if ((1 < idLen) &&
     ((((byte)ZvgIO.ecpFlags & 2) != 0 || (uVar2 = negotiate_1284('\x04'), uVar2 == 0)))) {
    ZvgIO.ecpFlags._0_1_ = (byte)ZvgIO.ecpFlags | 2;
    uVar2 = getByteNb((uchar *)((long)&local_4a + 1));
    if (uVar2 == 0) {
      uVar2 = getByteNb((uchar *)&local_4a);
    }
    if (uVar2 == 0) {
      if (local_4a < 3) {
        terminate_1284();
        *ss = '\0';
        *aReadLen = 0;
        uVar2 = 0x13;
      }
      else {
        uVar3 = local_4a - 2;
        uVar6 = idLen - 1;
        uVar4 = uVar6;
        if (uVar3 < uVar6) {
          uVar4 = uVar3;
        }
        if (uVar4 == 0) {
          byte = ss;
          uVar2 = 0;
          uVar4 = 0;
        }
        else {
          local_38 = (ulong)uVar6;
          if ((ulong)uVar3 < (ulong)uVar6) {
            local_38 = (ulong)uVar3;
          }
          lVar5 = 0;
          puVar7 = ss;
          local_48 = aReadLen;
          local_3c = uVar4;
          do {
            bVar1 = in((undefined2)ZvgIO.ecpDsr);
            aReadLen = local_48;
            byte = puVar7;
            uVar2 = 0;
            uVar4 = (uint)lVar5;
            if ((bVar1 & 8) != 0) break;
            byte = ss + lVar5;
            uVar2 = getByteNb(byte);
            aReadLen = local_48;
            if (uVar2 != 0) break;
            byte = puVar7 + 1;
            lVar5 = lVar5 + 1;
            puVar7 = byte;
            uVar2 = 0;
            uVar4 = local_3c;
          } while ((int)local_38 != (int)lVar5);
        }
        *byte = '\0';
        *aReadLen = uVar4;
        if (((byte)ZvgIO.ecpFlags & 3) != 0) {
          terminate_1284();
        }
      }
    }
  }
  return uVar2;
}

Assistant:

uint zvgGetDeviceID( uchar *ss, uint idLen, uint *aReadLen)
{
	uint	err, count, readLen;
	uchar	countMSB, countLSB=0;

	// if in ECP mode, terminate first

	if (ZvgIO.ecpFlags & ECPF_ECP)
		terminate_1284();

	if (idLen < 2)
		return (errEcpNoData);				// no room in buffer

	// do a REQ for ID using NIBBLE mode

	if (!(ZvgIO.ecpFlags & ECPF_NIBBLE))
		if ((err = (negotiate_1284( EMODE_REQID_NIBBLE))) != errOk)
			return (err);

	// up to us to set the flag

	ZvgIO.ecpFlags |= ECPF_NIBBLE;		// indicate nibble mode

	// get count word

	err = getByteNb( &countMSB);			// get a byte using nibble mode

	if (!err)
		err = getByteNb( &countLSB);

	// check for error reading first two bytes

	if (err)
		return (err);

	count = (countMSB << 8) + countLSB;

	if (count <= 2)
	{	terminate_1284();
		*ss = '\0';
		*aReadLen = 0;
		return (errEcpNoData);				// no proper ID is given
	}

	count -= 2;									// get number of bytes to read

	// check if it will fit in buffer, leave room for trailing '\0'

	if (count > idLen - 1)
		count = idLen - 1;

	readLen = 0;

	// read string of length 'count' from peripheral using the NIBBLE mode

	while (readLen < count && isDataAvail())
	{
		err = getByteNb( ss);

		if (err)
			break;

		ss++;
		readLen++;
	}
	*ss = '\0';
	*aReadLen = readLen;

	// switch to SPP mode (if not already there because of error)

	zvgSetSppMode();
	return (err);
}